

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateReturn(ExpressionTranslateContext *ctx,ExprReturn *expression)

{
  bool bVar1;
  ExprSequence *local_20;
  ExprSequence *closures;
  ExprReturn *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
  }
  local_20 = getType<ExprSequence>(expression->closures);
  if ((local_20 != (ExprSequence *)0x0) &&
     (bVar1 = SmallArray<ExprBase_*,_4U>::empty(&local_20->expressions), bVar1)) {
    local_20 = (ExprSequence *)0x0;
  }
  if (ctx->currentFunction == (FunctionData *)0x0) {
    if (local_20 != (ExprSequence *)0x0) {
      __assert_fail("!closures",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x3cb,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
    }
    if ((((expression->value->type == ctx->ctx->typeBool) ||
         (expression->value->type == ctx->ctx->typeChar)) ||
        (expression->value->type == ctx->ctx->typeShort)) ||
       (expression->value->type == ctx->ctx->typeInt)) {
      Print(ctx,"__nullcOutputResultInt((int)(");
    }
    else if (expression->value->type == ctx->ctx->typeLong) {
      Print(ctx,"__nullcOutputResultLong((long long)(");
    }
    else if ((expression->value->type == ctx->ctx->typeFloat) ||
            (expression->value->type == ctx->ctx->typeDouble)) {
      Print(ctx,"__nullcOutputResultDouble((double)(");
    }
    else {
      bVar1 = isType<TypeEnum>(expression->value->type);
      if (!bVar1) {
        __assert_fail("!\"unknown global return type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                      ,0x3d6,"void TranslateReturn(ExpressionTranslateContext &, ExprReturn *)");
      }
      Print(ctx,"__nullcOutputResultInt((int)(");
    }
    Translate(ctx,expression->value);
    bVar1 = isType<TypeEnum>(expression->value->type);
    if (bVar1) {
      Print(ctx,".value");
    }
    Print(ctx,"));");
    PrintLine(ctx);
    PrintIndent(ctx);
    Print(ctx,"return 0;");
  }
  else if (expression->value->type == ctx->ctx->typeVoid) {
    if (local_20 != (ExprSequence *)0x0) {
      Translate(ctx,expression->closures);
      Print(ctx,";");
      PrintLine(ctx);
      PrintIndent(ctx);
    }
    Translate(ctx,expression->value);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Print(ctx,"return;");
  }
  else if (local_20 == (ExprSequence *)0x0) {
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    Print(ctx,";");
  }
  else {
    Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
    Translate(ctx,expression->value);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Translate(ctx,expression->closures);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
  }
  return;
}

Assistant:

void TranslateReturn(ExpressionTranslateContext &ctx, ExprReturn *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(!ctx.currentFunction)
	{
		assert(!closures);

		if(expression->value->type == ctx.ctx.typeBool || expression->value->type == ctx.ctx.typeChar || expression->value->type == ctx.ctx.typeShort || expression->value->type == ctx.ctx.typeInt)
			Print(ctx, "__nullcOutputResultInt((int)(");
		else if(expression->value->type == ctx.ctx.typeLong)
			Print(ctx, "__nullcOutputResultLong((long long)(");
		else if(expression->value->type == ctx.ctx.typeFloat || expression->value->type == ctx.ctx.typeDouble)
			Print(ctx, "__nullcOutputResultDouble((double)(");
		else if(isType<TypeEnum>(expression->value->type))
			Print(ctx, "__nullcOutputResultInt((int)(");
		else
			assert(!"unknown global return type");

		Translate(ctx, expression->value);

		if(isType<TypeEnum>(expression->value->type))
			Print(ctx, ".value");

		Print(ctx, "));");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return 0;");
	}
	else
	{
		if(expression->value->type == ctx.ctx.typeVoid)
		{
			if(closures)
			{
				Translate(ctx, expression->closures);
				Print(ctx, ";");
				PrintLine(ctx);
				PrintIndent(ctx);
			}

			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return;");
		}
		else if(closures)
		{
			Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
			Translate(ctx, expression->value);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);

			Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
		}
		else
		{
			Print(ctx, "return ");
			Translate(ctx, expression->value);
			Print(ctx, ";");
		}
	}
}